

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRDecoder.cpp
# Opt level: O0

char ZXing::QRCode::ToAlphaNumericChar(int value)

{
  int iVar1;
  out_of_range *this;
  int in_EDI;
  char (*in_stack_ffffffffffffffe0) [45];
  
  if (-1 < in_EDI) {
    iVar1 = Size<char,45ul>(in_stack_ffffffffffffffe0);
    if (in_EDI < iVar1) {
      return "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ $%*+-./:"[in_EDI];
    }
  }
  this = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this,"ToAlphaNumericChar: out of range");
  __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

static char ToAlphaNumericChar(int value)
{
	/**
	* See ISO 18004:2006, 6.4.4 Table 5
	*/
	static const char ALPHANUMERIC_CHARS[] = {
		'0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B',
		'C', 'D', 'E', 'F', 'G', 'H', 'I', 'J', 'K', 'L', 'M', 'N',
		'O', 'P', 'Q', 'R', 'S', 'T', 'U', 'V', 'W', 'X', 'Y', 'Z',
		' ', '$', '%', '*', '+', '-', '.', '/', ':'
	};

	if (value < 0 || value >= Size(ALPHANUMERIC_CHARS))
		throw std::out_of_range("ToAlphaNumericChar: out of range");

	return ALPHANUMERIC_CHARS[value];
}